

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.hpp
# Opt level: O0

uint __thiscall Kernel::Signature::getArrayConstructor(Signature *this)

{
  initializer_list<Kernel::TermList> sorts;
  uint uVar1;
  TermList resultSort;
  Symbol *this_00;
  long in_RDI;
  bool *in_stack_00000030;
  uint in_stack_0000003c;
  string *in_stack_00000040;
  Signature *in_stack_00000048;
  Symbol *arr;
  TermList ss;
  uint array;
  bool added;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  Signature *in_stack_ffffffffffffff60;
  uint taArity;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_31;
  string local_30 [32];
  uint local_10;
  byte local_9;
  
  local_9 = 0;
  taArity = (uint)((ulong)&local_31 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  uVar1 = addTypeCon(in_stack_00000048,in_stack_00000040,in_stack_0000003c,in_stack_00000030);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  local_10 = uVar1;
  if ((local_9 & 1) != 0) {
    *(uint *)(in_RDI + 0x208) = uVar1;
    resultSort = AtomicSort::superSort();
    this_00 = getTypeCon(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    sorts._M_len = resultSort._content;
    sorts._M_array = (iterator)resultSort._content;
    OperatorType::getFunctionType(sorts,resultSort,taArity);
    Symbol::setType(this_00,(OperatorType *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  return local_10;
}

Assistant:

unsigned getArrayConstructor(){
    bool added = false;
    unsigned array = addTypeCon("Array",2, added);
    if(added){
      _arrayCon = array;
      TermList ss = AtomicSort::superSort();
      Symbol* arr = getTypeCon(array);
      arr->setType(OperatorType::getFunctionType({ss, ss}, ss));
    }
    return array;    
  }